

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCurl.cxx
# Opt level: O1

string * __thiscall
cmCTestCurl::Escape(string *__return_storage_ptr__,cmCTestCurl *this,string *source)

{
  char *__ptr;
  allocator local_11;
  
  __ptr = curl_easy_escape(this->Curl,(source->_M_dataplus)._M_p,0);
  std::__cxx11::string::string((string *)__return_storage_ptr__,__ptr,&local_11);
  curl_free(__ptr);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestCurl::Escape(std::string const& source)
{
  char* data1 = curl_easy_escape(this->Curl, source.c_str(), 0);
  std::string ret = data1;
  curl_free(data1);
  return ret;
}